

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

bool google::protobuf::compiler::java::anon_unknown_7::EqualWithSuffix
               (string_view name1,string_view suffix,string_view name2)

{
  int iVar1;
  ulong __n;
  size_t __n_00;
  ulong uVar2;
  size_type __rlen_1;
  bool bVar3;
  
  __n_00 = name1._M_len;
  uVar2 = name2._M_len;
  __n = suffix._M_len;
  if ((((__n == 0) ||
       ((bVar3 = __n <= uVar2, uVar2 = uVar2 - __n, bVar3 &&
        (iVar1 = bcmp(name2._M_str + uVar2,suffix._M_str,__n), iVar1 == 0)))) && (uVar2 == __n_00))
     && ((__n_00 == 0 || (iVar1 = bcmp(name1._M_str,name2._M_str,__n_00), iVar1 == 0)))) {
    return true;
  }
  return false;
}

Assistant:

bool EqualWithSuffix(absl::string_view name1, absl::string_view suffix,
                     absl::string_view name2) {
  if (!absl::ConsumeSuffix(&name2, suffix)) return false;
  return name1 == name2;
}